

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-ws.cpp
# Opt level: O0

bool __thiscall
ImGuiWS::setTexture(ImGuiWS *this,TextureId textureId,Type textureType,int32_t width,int32_t height,
                   char *data)

{
  int iVar1;
  bool bVar2;
  reference ppVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  char *pcVar6;
  pointer pIVar7;
  int in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  vector<char,_std::allocator<char>_> *in_RDI;
  int in_R8D;
  void *in_R9;
  unique_lock<std::shared_mutex> lock;
  size_t offset;
  int revision;
  pair<const_unsigned_int,_ImGuiWS::Texture> *t;
  iterator __end2;
  iterator __begin2;
  map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
  *__range2;
  int idx;
  int bpp;
  Texture *in_stack_ffffffffffffff38;
  Data *pDVar8;
  unique_lock<std::shared_mutex> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  key_type_conflict *in_stack_ffffffffffffff78;
  map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
  *in_stack_ffffffffffffff80;
  _Self local_58;
  _Self local_50;
  map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
  *local_48;
  int local_3c;
  _Self local_38;
  _Self local_30;
  int local_24;
  void *local_20;
  int local_18;
  int local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  local_24 = 1;
  switch(in_EDX) {
  case 0:
    local_24 = 1;
    break;
  case 1:
    local_24 = 1;
    break;
  case 2:
    local_24 = 3;
    break;
  case 3:
    local_24 = 4;
  }
  local_20 = in_R9;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d029f);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
       ::find((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
               *)in_stack_ffffffffffffff38,(key_type_conflict *)0x1d02b7);
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d02c9);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
       ::end((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
              *)in_stack_ffffffffffffff38);
  bVar2 = std::operator==(&local_30,&local_38);
  if (bVar2) {
    std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
              ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d0309);
    pmVar5 = std::
             map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
             ::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    pmVar5->revision = 0;
    std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
              ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d0331);
    std::
    map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
    ::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::vector<char,_std::allocator<char>_>::clear((vector<char,_std::allocator<char>_> *)0x1d0355)
    ;
    std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
              ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d035f);
    std::
    map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>::
    clear((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           *)0x1d036b);
    local_3c = 0;
    pIVar7 = std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
                       ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d0380);
    local_48 = &(pIVar7->dataWrite).textures;
    local_50._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
         ::begin((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                  *)in_stack_ffffffffffffff38);
    local_58._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
         ::end((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                *)in_stack_ffffffffffffff38);
    while (bVar2 = std::operator!=(&local_50,&local_58), bVar2) {
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>::operator*
                         ((_Rb_tree_iterator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_> *)
                          0x1d03d3);
      in_stack_ffffffffffffff5c = ppVar3->first;
      std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
                ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d03ed);
      local_3c = local_3c + 1;
      pmVar4 = std::
               map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
               ::operator[]((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                             *)in_stack_ffffffffffffff80,(key_type *)in_stack_ffffffffffffff78);
      *pmVar4 = in_stack_ffffffffffffff5c;
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_> *)
                 in_stack_ffffffffffffff40);
    }
  }
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d0433);
  pmVar5 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pmVar5->revision = pmVar5->revision + 1;
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d045c);
  std::
  map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
  ::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::vector<char,_std::allocator<char>_>::resize
            (in_RDI,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d04a5);
  pmVar5 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  iVar1 = pmVar5->revision;
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d04cf);
  std::
  map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
  ::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pcVar6 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x1d04ec);
  *(undefined4 *)pcVar6 = local_c;
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d0513);
  std::
  map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
  ::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pcVar6 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x1d0530);
  *(undefined4 *)(pcVar6 + 4) = local_10;
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d0557);
  std::
  map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
  ::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pcVar6 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x1d0574);
  *(int *)(pcVar6 + 8) = local_14;
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d059b);
  std::
  map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
  ::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pcVar6 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x1d05b8);
  *(int *)(pcVar6 + 0xc) = local_18;
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d05df);
  std::
  map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
  ::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pcVar6 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x1d05fc);
  *(int *)(pcVar6 + 0x10) = iVar1;
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d0620);
  std::
  map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
  ::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pcVar6 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x1d063d);
  memcpy(pcVar6 + 0x14,local_20,(long)(local_24 * local_14 * local_18));
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d067d);
  std::unique_lock<std::shared_mutex>::unique_lock
            (in_stack_ffffffffffffff40,(mutex_type *)in_stack_ffffffffffffff38);
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d0698);
  std::
  map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
  ::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d06ba);
  pmVar5 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  Texture::operator=(pmVar5,in_stack_ffffffffffffff38);
  pIVar7 = std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
                     ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d06f3);
  pDVar8 = &pIVar7->dataWrite;
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d0705);
  std::map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  ::operator=((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
               *)pmVar5,&pDVar8->textureIdMap);
  std::unique_lock<std::shared_mutex>::~unique_lock((unique_lock<std::shared_mutex> *)pmVar5);
  return true;
}

Assistant:

bool ImGuiWS::setTexture(TextureId textureId, Texture::Type textureType, int32_t width, int32_t height, const char * data) {
    int bpp = 1; // bytes per pixel
    switch (textureType) {
        case Texture::Type::Alpha8: bpp = 1; break;
        case Texture::Type::Gray8:  bpp = 1; break;
        case Texture::Type::RGB24:  bpp = 3; break;
        case Texture::Type::RGBA32: bpp = 4; break;
    };

    if (m_impl->dataWrite.textures.find(textureId) == m_impl->dataWrite.textures.end()) {
        m_impl->dataWrite.textures[textureId].revision = 0;
        m_impl->dataWrite.textures[textureId].data.clear();
        m_impl->dataWrite.textureIdMap.clear();

        int idx = 0;
        for (const auto & t : m_impl->dataWrite.textures) {
            m_impl->dataWrite.textureIdMap[idx++] = t.first;
        }
    }

    m_impl->dataWrite.textures[textureId].revision++;
    m_impl->dataWrite.textures[textureId].data.resize(sizeof(TextureId) + sizeof(Texture::Type) + 3*sizeof(int32_t) + bpp*width*height);

    int revision = m_impl->dataWrite.textures[textureId].revision;

    size_t offset = 0;
    std::memcpy(m_impl->dataWrite.textures[textureId].data.data() + offset, &textureId, sizeof(textureId)); offset += sizeof(textureId);
    std::memcpy(m_impl->dataWrite.textures[textureId].data.data() + offset, &textureType, sizeof(textureType)); offset += sizeof(textureType);
    std::memcpy(m_impl->dataWrite.textures[textureId].data.data() + offset, &width, sizeof(width)); offset += sizeof(width);
    std::memcpy(m_impl->dataWrite.textures[textureId].data.data() + offset, &height, sizeof(height)); offset += sizeof(height);
    std::memcpy(m_impl->dataWrite.textures[textureId].data.data() + offset, &revision, sizeof(revision)); offset += sizeof(revision);
    std::memcpy(m_impl->dataWrite.textures[textureId].data.data() + offset, data, bpp*width*height);

    {
        std::unique_lock lock(m_impl->mutex);
        m_impl->dataRead.textures[textureId] = m_impl->dataWrite.textures[textureId];
        m_impl->dataRead.textureIdMap = m_impl->dataWrite.textureIdMap;
    }

    return true;
}